

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *__name;
  char *__service;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  FILE *pFVar7;
  stack_st_X509 *certs;
  X509 *pXVar8;
  size_t sVar9;
  socklen_t sVar10;
  code *pcVar11;
  char *pcVar12;
  long lVar13;
  char **ppcVar14;
  ptls_openssl_verify_certificate_t verify_certificate;
  ptls_context_t ctx;
  ptls_save_ticket_t save_ticket;
  ptls_encrypt_ticket_t decrypt_ticket;
  ptls_encrypt_ticket_t encrypt_ticket;
  sockaddr_storage sa;
  ptls_openssl_lookup_certificate_t lookup_certificate;
  addrinfo hints;
  EVP_PKEY *local_1b8;
  ptls_openssl_verify_certificate_t local_1a8;
  uint8_t *local_198;
  size_t sStack_190;
  size_t *local_188;
  undefined8 uStack_180;
  code *local_170;
  ptls_key_exchange_algorithm_t **local_168;
  ptls_cipher_suite_t **local_160;
  ptls_openssl_lookup_certificate_t *local_158;
  ptls_openssl_verify_certificate_t *local_150;
  undefined8 local_148;
  undefined4 local_140;
  code **local_138;
  code **local_130;
  code **local_128;
  code *local_120;
  code *local_118;
  code *local_110;
  addrinfo *local_108;
  ptls_buffer_t local_100 [4];
  ptls_openssl_lookup_certificate_t local_80;
  addrinfo local_68;
  
  local_1b8 = (EVP_PKEY *)0x0;
  OPENSSL_init_crypto(2,0);
  OPENSSL_init_crypto(0xc,0);
  ENGINE_load_builtin_engines();
  ENGINE_register_all_ciphers();
  ENGINE_register_all_digests();
  local_138 = &local_110;
  local_110 = encrypt_ticket_cb;
  local_130 = &local_118;
  local_118 = decrypt_ticket_cb;
  local_128 = &local_120;
  local_120 = save_ticket_cb;
  local_170 = ptls_openssl_random_bytes;
  local_168 = ptls_openssl_key_exchanges;
  local_160 = ptls_openssl_cipher_suites;
  local_158 = &local_80;
  local_150 = (ptls_openssl_verify_certificate_t *)0x0;
  local_148 = 0x200000015180;
  local_140 = 0;
  local_1a8.super.cb =
       (_func_int_st_ptls_verify_certificate_t_ptr_ptls_t_ptr__func_int_void_ptr_ptls_iovec_t_ptls_iovec_t_ptr_ptr_void_ptr_ptr_ptls_iovec_t_ptr_size_t
        *)0x0;
  local_1a8.cert_store = (X509_STORE *)0x0;
  local_188 = (size_t *)0x0;
  uStack_180 = 0;
  local_198 = (uint8_t *)0x0;
  sStack_190 = 0;
  ptls_openssl_init_lookup_certificate(local_158);
  bVar2 = true;
  certs = (stack_st_X509 *)0x0;
  iVar6 = 0;
LAB_00103b0e:
  do {
    iVar3 = getopt(argc,argv,"c:k:es:vh");
    iVar4 = _optind;
    if (iVar3 < 0x6b) {
      if (iVar3 == -1) {
        lVar13 = (long)_optind;
        if (certs == (stack_st_X509 *)0x0 && local_1b8 == (EVP_PKEY *)0x0) {
          if (session_file != (char *)0x0) {
            local_100[0].base = "";
            local_100[0].capacity = 0;
            local_100[0].off = 0;
            local_100[0].is_allocated = 0;
            pFVar7 = fopen(session_file,"rb");
            if (pFVar7 != (FILE *)0x0) {
              ppcVar14 = argv;
              do {
                uVar5 = ptls_buffer_reserve(local_100,0x100);
                if (uVar5 == 0) {
                  sVar9 = fread(local_100[0].base + local_100[0].off,1,0x100,pFVar7);
                  if (sVar9 == 0) {
                    iVar6 = 3;
                  }
                  else {
                    local_100[0].off = local_100[0].off + sVar9;
                    iVar6 = 0;
                  }
                }
                else {
                  iVar6 = 1;
                  ppcVar14 = (char **)(ulong)uVar5;
                }
              } while (iVar6 == 0);
              if (iVar6 == 3) {
                fclose(pFVar7);
LAB_00103dbc:
                local_198 = local_100[0].base;
                sStack_190 = local_100[0].off;
              }
              else if ((int)ppcVar14 == 0) goto LAB_00103dbc;
            }
          }
          if (!bVar2) {
            local_188 = &main::max_early_data_size;
          }
LAB_00103de9:
          if (local_1a8.super.cb ==
              (_func_int_st_ptls_verify_certificate_t_ptr_ptls_t_ptr__func_int_void_ptr_ptls_iovec_t_ptls_iovec_t_ptr_ptr_void_ptr_ptr_ptls_iovec_t_ptr_size_t
               *)0x0) {
            ptls_openssl_init_verify_certificate(&local_1a8,(X509_STORE *)0x0);
          }
          local_150 = &local_1a8;
          if (argc - iVar4 == 2) {
            __name = argv[lVar13];
            __service = argv[lVar13 + 1];
            local_68.ai_addrlen = 0;
            local_68._20_4_ = 0;
            local_68.ai_addr = (sockaddr *)0x0;
            local_68.ai_canonname = (char *)0x0;
            local_68.ai_next = (addrinfo *)0x0;
            local_68.ai_socktype = 1;
            local_68.ai_protocol = 6;
            local_68.ai_flags = 0x421;
            local_68.ai_family = 0;
            iVar6 = getaddrinfo(__name,__service,&local_68,&local_108);
            pFVar7 = _stderr;
            if (local_108 == (addrinfo *)0x0 || iVar6 != 0) {
              if (iVar6 == 0) {
                pcVar12 = "getaddrinfo returned NULL";
              }
              else {
                pcVar12 = gai_strerror(iVar6);
              }
              fprintf(pFVar7,"failed to resolve address:%s:%s:%s\n",__name,__service,pcVar12);
              sVar10 = 2;
            }
            else {
              memcpy(local_100,local_108->ai_addr,(ulong)local_108->ai_addrlen);
              sVar10 = local_108->ai_addrlen;
              freeaddrinfo(local_108);
            }
            if (local_108 == (addrinfo *)0x0 || iVar6 != 0) {
LAB_00103f44:
              exit(1);
            }
            pcVar11 = run_client;
            if (certs != (stack_st_X509 *)0x0) {
              pcVar11 = run_server;
            }
            iVar6 = (*pcVar11)(local_100,sVar10,&local_170,&local_198);
          }
          else {
            main_cold_7();
LAB_00103f0e:
            iVar6 = 1;
          }
          return iVar6;
        }
        if ((certs == (stack_st_X509 *)0x0) || (local_1b8 == (EVP_PKEY *)0x0)) {
          main_cold_8();
          goto LAB_00103f0e;
        }
        if (session_file != (char *)0x0) {
          main_cold_5();
          goto LAB_00103f0e;
        }
        if (bVar2) {
          ptls_openssl_lookup_certificate_add_identity
                    (&local_80,"example.com",(EVP_PKEY *)local_1b8,certs);
          OPENSSL_sk_free(certs);
          EVP_PKEY_free(local_1b8);
          goto LAB_00103de9;
        }
        main_cold_6();
        goto LAB_00103f0e;
      }
      if (iVar3 != 99) {
        if (iVar3 != 0x65) {
LAB_00103f3c:
          usage(*argv);
          goto LAB_00103f44;
        }
        bVar2 = false;
        goto LAB_00103b0e;
      }
      pFVar7 = fopen(_optarg,"rb");
      if (pFVar7 == (FILE *)0x0) {
        main_cold_4();
      }
      else {
        certs = (stack_st_X509 *)OPENSSL_sk_new(0);
        while (pXVar8 = PEM_read_X509(pFVar7,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0),
              pXVar8 != (X509 *)0x0) {
          OPENSSL_sk_push(certs);
        }
        fclose(pFVar7);
        iVar4 = OPENSSL_sk_num(certs);
        bVar1 = true;
        if (iVar4 != 0) goto joined_r0x00103c47;
        main_cold_3();
      }
      iVar6 = 1;
      bVar1 = false;
    }
    else {
      if (iVar3 == 0x73) {
        session_file = _optarg;
        goto LAB_00103b0e;
      }
      if (iVar3 == 0x76) {
        ptls_openssl_init_verify_certificate(&local_1a8,(X509_STORE *)0x0);
        goto LAB_00103b0e;
      }
      if (iVar3 != 0x6b) goto LAB_00103f3c;
      pFVar7 = fopen(_optarg,"rb");
      if (pFVar7 == (FILE *)0x0) {
        main_cold_2();
      }
      else {
        local_1b8 = PEM_read_PrivateKey(pFVar7,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
        fclose(pFVar7);
        if (local_1b8 != (EVP_PKEY *)0x0) {
          bVar1 = true;
          goto joined_r0x00103c47;
        }
        main_cold_1();
        local_1b8 = (EVP_PKEY *)0x0;
      }
      iVar6 = 1;
      bVar1 = false;
    }
joined_r0x00103c47:
    if (!bVar1) {
      return iVar6;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    ERR_load_crypto_strings();
    OpenSSL_add_all_algorithms();
#if !defined(OPENSSL_NO_ENGINE)
    /* Load all compiled-in ENGINEs */
    ENGINE_load_builtin_engines();
    ENGINE_register_all_ciphers();
    ENGINE_register_all_digests();
#endif

    ptls_openssl_lookup_certificate_t lookup_certificate;
    ptls_encrypt_ticket_t encrypt_ticket = {encrypt_ticket_cb}, decrypt_ticket = {decrypt_ticket_cb};
    ptls_save_ticket_t save_ticket = {save_ticket_cb};
    ptls_context_t ctx = {ptls_openssl_random_bytes,
                          ptls_openssl_key_exchanges,
                          ptls_openssl_cipher_suites,
                          &lookup_certificate.super,
                          NULL,
                          86400,
                          8192,
                          0,
                          &encrypt_ticket,
                          &decrypt_ticket,
                          &save_ticket};
    ptls_openssl_verify_certificate_t verify_certificate = {{NULL}};
    ptls_handshake_properties_t hsprop = {{{NULL}}};
    const char *host, *port;
    STACK_OF(X509) *certs = NULL;
    EVP_PKEY *pkey = NULL;
    int use_early_data = 0, ch;
    struct sockaddr_storage sa;
    socklen_t salen;

    ptls_openssl_init_lookup_certificate(&lookup_certificate);

    while ((ch = getopt(argc, argv, "c:k:es:vh")) != -1) {
        switch (ch) {
        case 'c': {
            FILE *fp;
            X509 *cert;
            if ((fp = fopen(optarg, "rb")) == NULL) {
                fprintf(stderr, "failed to open file:%s:%s\n", optarg, strerror(errno));
                return 1;
            }
            certs = sk_X509_new(NULL);
            while ((cert = PEM_read_X509(fp, NULL, NULL, NULL)) != NULL)
                sk_X509_push(certs, cert);
            fclose(fp);
            if (sk_X509_num(certs) == 0) {
                fprintf(stderr, "failed to load certificate chain from file:%s\n", optarg);
                return 1;
            }
        } break;
        case 'k': {
            FILE *fp;
            if ((fp = fopen(optarg, "rb")) == NULL) {
                fprintf(stderr, "failed to open file:%s:%s\n", optarg, strerror(errno));
                return 1;
            }
            pkey = PEM_read_PrivateKey(fp, NULL, NULL, NULL);
            fclose(fp);
            if (pkey == NULL) {
                fprintf(stderr, "failed to load private key from file:%s\n", optarg);
                return 1;
            }
        } break;
        case 'e':
            use_early_data = 1;
            break;
        case 's':
            session_file = optarg;
            break;
        case 'v':
            ptls_openssl_init_verify_certificate(&verify_certificate, NULL);
            break;
        default:
            usage(argv[0]);
            exit(1);
        }
    }
    argc -= optind;
    argv += optind;
    if (certs != NULL || pkey != NULL) {
        /* server */
        if (certs == NULL || pkey == NULL) {
            fprintf(stderr, "-c and -k options must be used together\n");
            return 1;
        }
        if (session_file != NULL) {
            fprintf(stderr, "-s option cannot be used for server\n");
            return 1;
        }
        if (use_early_data) {
            fprintf(stderr, "-e option cannot be used for server\n");
            return 1;
        }
        ptls_openssl_lookup_certificate_add_identity(&lookup_certificate, "example.com", pkey, certs);
        sk_X509_free(certs);
        EVP_PKEY_free(pkey);
    } else {
        /* client */
        if (session_file != NULL) {
            ptls_buffer_t sessdata;
            ptls_buffer_init(&sessdata, "", 0);
            if (load_ticket(&sessdata) == 0)
                hsprop.client.session_ticket = ptls_iovec_init(sessdata.base, sessdata.off);
        }
        if (use_early_data) {
            static size_t max_early_data_size;
            hsprop.client.max_early_data_size = &max_early_data_size;
        }
    }
    if (verify_certificate.super.cb == NULL)
        ptls_openssl_init_verify_certificate(&verify_certificate, NULL);
    ctx.verify_certificate = &verify_certificate.super;
    if (argc != 2) {
        fprintf(stderr, "missing host and port\n");
        return 1;
    }
    host = (--argc, *argv++);
    port = (--argc, *argv++);

    if (resolve_address((struct sockaddr *)&sa, &salen, host, port) != 0)
        exit(1);

    return (certs != NULL ? run_server : run_client)((struct sockaddr *)&sa, salen, &ctx, &hsprop);
}